

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

_Bool ImGui::NavScoreItem(ImGuiNavItemData *result)

{
  ImGuiWindow_conflict *pIVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  ImGuiContext_conflict *pIVar4;
  _Bool _Var5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float local_88;
  bool local_71;
  ImGuiDir move_dir;
  float fStack_6c;
  _Bool new_best;
  float dist_axial;
  float day;
  float dax;
  ImGuiDir quadrant;
  float dist_center;
  float dcy;
  float dcx;
  float dist_box;
  float dby;
  float dbx;
  ImRect curr;
  ImRect cand;
  ImGuiWindow_conflict *window;
  ImGuiContext_conflict *g;
  ImGuiNavItemData *result_local;
  
  pIVar4 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  if (GImGui->NavLayer == (pIVar1->DC).NavLayerCurrent) {
    curr.Max = (GImGui->LastItemData).NavRect.Min;
    IVar2 = (GImGui->LastItemData).NavRect.Max;
    IVar3 = (GImGui->NavScoringRect).Min;
    curr.Min = (GImGui->NavScoringRect).Max;
    GImGui->NavScoringDebugCount = GImGui->NavScoringDebugCount + 1;
    if (pIVar1->ParentWindow == pIVar4->NavWindow) {
      if (((pIVar1->Flags | pIVar4->NavWindow->Flags) & 0x800000U) == 0) {
        __assert_fail("(window->Flags | g.NavWindow->Flags) & ImGuiWindowFlags_NavFlattened",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                      ,0x252a,"bool ImGui::NavScoreItem(ImGuiNavItemData *)");
      }
      _Var5 = ImRect::Overlaps(&pIVar1->ClipRect,(ImRect *)&curr.Max);
      if (!_Var5) {
        return false;
      }
      ImRect::ClipWithFull((ImRect *)&curr.Max,&pIVar1->ClipRect);
    }
    NavClampRectToVisibleAreaForMoveDir
              (pIVar4->NavMoveClipDir,(ImRect *)&curr.Max,&pIVar1->ClipRect);
    cand.Min.x = IVar2.x;
    dby = IVar3.x;
    dist_box = NavScoreItemDistInterval(curr.Max.x,cand.Min.x,dby,curr.Min.x);
    cand.Min.y = IVar2.y;
    fVar6 = ImLerp<float>(curr.Max.y,cand.Min.y,0.2);
    fVar7 = ImLerp<float>(curr.Max.y,cand.Min.y,0.8);
    dbx = IVar3.y;
    fVar8 = ImLerp<float>(dbx,curr.Min.y,0.2);
    fVar9 = ImLerp<float>(dbx,curr.Min.y,0.8);
    local_88 = NavScoreItemDistInterval(fVar6,fVar7,fVar8,fVar9);
    if (((local_88 != 0.0) || (NAN(local_88))) && ((dist_box != 0.0 || (NAN(dist_box))))) {
      dist_box = dist_box / 1000.0 +
                 (float)(~-(uint)(0.0 < dist_box) & 0xbf800000 |
                        -(uint)(0.0 < dist_box) & 0x3f800000);
    }
    fVar6 = ABS(dist_box) + ABS(local_88);
    fVar7 = (curr.Max.x + cand.Min.x) - (dby + curr.Min.x);
    fVar8 = (curr.Max.y + cand.Min.y) - (dbx + curr.Min.y);
    fVar9 = ABS(fVar7) + ABS(fVar8);
    dist_axial = 0.0;
    fStack_6c = 0.0;
    move_dir = 0;
    if (((dist_box != 0.0) || (local_88 != 0.0)) || (NAN(local_88))) {
      dist_axial = dist_box;
      day = (float)ImGetDirQuadrantFromDelta(dist_box,local_88);
      move_dir = (ImGuiDir)fVar6;
      fStack_6c = local_88;
    }
    else if (((fVar7 != 0.0) || (fVar8 != 0.0)) || (NAN(fVar8))) {
      day = (float)ImGetDirQuadrantFromDelta(fVar7,fVar8);
      move_dir = (ImGuiDir)fVar9;
      fStack_6c = fVar8;
      dist_axial = fVar7;
    }
    else {
      day = (float)(uint)(pIVar4->NavId <= (pIVar4->LastItemData).ID);
    }
    local_71 = false;
    fVar7 = (float)pIVar4->NavMoveDir;
    if (day == fVar7) {
      if (fVar6 < result->DistBox) {
        result->DistBox = fVar6;
        result->DistCenter = fVar9;
        return true;
      }
      if ((fVar6 == result->DistBox) && (!NAN(fVar6) && !NAN(result->DistBox))) {
        if (result->DistCenter <= fVar9) {
          if ((fVar9 == result->DistCenter) && (!NAN(fVar9) && !NAN(result->DistCenter))) {
            if ((fVar7 != 2.8026e-45) && (fVar7 != 4.2039e-45)) {
              local_88 = dist_box;
            }
            local_71 = local_88 < 0.0;
          }
        }
        else {
          result->DistCenter = fVar9;
          local_71 = true;
        }
      }
    }
    if (((((result->DistBox == 3.4028235e+38) && (!NAN(result->DistBox))) &&
         ((float)move_dir < result->DistAxial)) &&
        ((pIVar4->NavLayer == ImGuiNavLayer_Menu && ((pIVar4->NavWindow->Flags & 0x10000000U) == 0))
        )) && (((((fVar7 == 0.0 && (dist_axial < 0.0)) ||
                 ((fVar7 == 1.4013e-45 && (0.0 < dist_axial)))) ||
                ((fVar7 == 2.8026e-45 && (fStack_6c < 0.0)))) ||
               ((fVar7 == 4.2039e-45 && (0.0 < fStack_6c)))))) {
      result->DistAxial = (float)move_dir;
      local_71 = true;
    }
    result_local._7_1_ = local_71;
  }
  else {
    result_local._7_1_ = false;
  }
  return result_local._7_1_;
}

Assistant:

static bool ImGui::NavScoreItem(ImGuiNavItemData* result)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (g.NavLayer != window->DC.NavLayerCurrent)
        return false;

    // FIXME: Those are not good variables names
    ImRect cand = g.LastItemData.NavRect;   // Current item nav rectangle
    const ImRect curr = g.NavScoringRect;   // Current modified source rect (NB: we've applied Max.x = Min.x in NavUpdate() to inhibit the effect of having varied item width)
    g.NavScoringDebugCount++;

    // When entering through a NavFlattened border, we consider child window items as fully clipped for scoring
    if (window->ParentWindow == g.NavWindow)
    {
        IM_ASSERT((window->Flags | g.NavWindow->Flags) & ImGuiWindowFlags_NavFlattened);
        if (!window->ClipRect.Overlaps(cand))
            return false;
        cand.ClipWithFull(window->ClipRect); // This allows the scored item to not overlap other candidates in the parent window
    }

    // We perform scoring on items bounding box clipped by the current clipping rectangle on the other axis (clipping on our movement axis would give us equal scores for all clipped items)
    // For example, this ensure that items in one column are not reached when moving vertically from items in another column.
    NavClampRectToVisibleAreaForMoveDir(g.NavMoveClipDir, cand, window->ClipRect);

    // Compute distance between boxes
    // FIXME-NAV: Introducing biases for vertical navigation, needs to be removed.
    float dbx = NavScoreItemDistInterval(cand.Min.x, cand.Max.x, curr.Min.x, curr.Max.x);
    float dby = NavScoreItemDistInterval(ImLerp(cand.Min.y, cand.Max.y, 0.2f), ImLerp(cand.Min.y, cand.Max.y, 0.8f), ImLerp(curr.Min.y, curr.Max.y, 0.2f), ImLerp(curr.Min.y, curr.Max.y, 0.8f)); // Scale down on Y to keep using box-distance for vertically touching items
    if (dby != 0.0f && dbx != 0.0f)
        dbx = (dbx / 1000.0f) + ((dbx > 0.0f) ? +1.0f : -1.0f);
    float dist_box = ImFabs(dbx) + ImFabs(dby);

    // Compute distance between centers (this is off by a factor of 2, but we only compare center distances with each other so it doesn't matter)
    float dcx = (cand.Min.x + cand.Max.x) - (curr.Min.x + curr.Max.x);
    float dcy = (cand.Min.y + cand.Max.y) - (curr.Min.y + curr.Max.y);
    float dist_center = ImFabs(dcx) + ImFabs(dcy); // L1 metric (need this for our connectedness guarantee)

    // Determine which quadrant of 'curr' our candidate item 'cand' lies in based on distance
    ImGuiDir quadrant;
    float dax = 0.0f, day = 0.0f, dist_axial = 0.0f;
    if (dbx != 0.0f || dby != 0.0f)
    {
        // For non-overlapping boxes, use distance between boxes
        dax = dbx;
        day = dby;
        dist_axial = dist_box;
        quadrant = ImGetDirQuadrantFromDelta(dbx, dby);
    }
    else if (dcx != 0.0f || dcy != 0.0f)
    {
        // For overlapping boxes with different centers, use distance between centers
        dax = dcx;
        day = dcy;
        dist_axial = dist_center;
        quadrant = ImGetDirQuadrantFromDelta(dcx, dcy);
    }
    else
    {
        // Degenerate case: two overlapping buttons with same center, break ties arbitrarily (note that LastItemId here is really the _previous_ item order, but it doesn't matter)
        quadrant = (g.LastItemData.ID < g.NavId) ? ImGuiDir_Left : ImGuiDir_Right;
    }

#if IMGUI_DEBUG_NAV_SCORING
    char buf[128];
    if (IsMouseHoveringRect(cand.Min, cand.Max))
    {
        ImFormatString(buf, IM_ARRAYSIZE(buf), "dbox (%.2f,%.2f->%.4f)\ndcen (%.2f,%.2f->%.4f)\nd (%.2f,%.2f->%.4f)\nnav %c, quadrant %c", dbx, dby, dist_box, dcx, dcy, dist_center, dax, day, dist_axial, "WENS"[g.NavMoveDir], "WENS"[quadrant]);
        ImDrawList* draw_list = GetForegroundDrawList(window);
        draw_list->AddRect(curr.Min, curr.Max, IM_COL32(255,200,0,100));
        draw_list->AddRect(cand.Min, cand.Max, IM_COL32(255,255,0,200));
        draw_list->AddRectFilled(cand.Max - ImVec2(4, 4), cand.Max + CalcTextSize(buf) + ImVec2(4, 4), IM_COL32(40,0,0,150));
        draw_list->AddText(cand.Max, ~0U, buf);
    }
    else if (g.IO.KeyCtrl) // Hold to preview score in matching quadrant. Press C to rotate.
    {
        if (quadrant == g.NavMoveDir)
        {
            ImFormatString(buf, IM_ARRAYSIZE(buf), "%.0f/%.0f", dist_box, dist_center);
            ImDrawList* draw_list = GetForegroundDrawList(window);
            draw_list->AddRectFilled(cand.Min, cand.Max, IM_COL32(255, 0, 0, 200));
            draw_list->AddText(cand.Min, IM_COL32(255, 255, 255, 255), buf);
        }
    }
#endif

    // Is it in the quadrant we're interesting in moving to?
    bool new_best = false;
    const ImGuiDir move_dir = g.NavMoveDir;
    if (quadrant == move_dir)
    {
        // Does it beat the current best candidate?
        if (dist_box < result->DistBox)
        {
            result->DistBox = dist_box;
            result->DistCenter = dist_center;
            return true;
        }
        if (dist_box == result->DistBox)
        {
            // Try using distance between center points to break ties
            if (dist_center < result->DistCenter)
            {
                result->DistCenter = dist_center;
                new_best = true;
            }
            else if (dist_center == result->DistCenter)
            {
                // Still tied! we need to be extra-careful to make sure everything gets linked properly. We consistently break ties by symbolically moving "later" items
                // (with higher index) to the right/downwards by an infinitesimal amount since we the current "best" button already (so it must have a lower index),
                // this is fairly easy. This rule ensures that all buttons with dx==dy==0 will end up being linked in order of appearance along the x axis.
                if (((move_dir == ImGuiDir_Up || move_dir == ImGuiDir_Down) ? dby : dbx) < 0.0f) // moving bj to the right/down decreases distance
                    new_best = true;
            }
        }
    }

    // Axial check: if 'curr' has no link at all in some direction and 'cand' lies roughly in that direction, add a tentative link. This will only be kept if no "real" matches
    // are found, so it only augments the graph produced by the above method using extra links. (important, since it doesn't guarantee strong connectedness)
    // This is just to avoid buttons having no links in a particular direction when there's a suitable neighbor. you get good graphs without this too.
    // 2017/09/29: FIXME: This now currently only enabled inside menu bars, ideally we'd disable it everywhere. Menus in particular need to catch failure. For general navigation it feels awkward.
    // Disabling it may lead to disconnected graphs when nodes are very spaced out on different axis. Perhaps consider offering this as an option?
    if (result->DistBox == FLT_MAX && dist_axial < result->DistAxial)  // Check axial match
        if (g.NavLayer == ImGuiNavLayer_Menu && !(g.NavWindow->Flags & ImGuiWindowFlags_ChildMenu))
            if ((move_dir == ImGuiDir_Left && dax < 0.0f) || (move_dir == ImGuiDir_Right && dax > 0.0f) || (move_dir == ImGuiDir_Up && day < 0.0f) || (move_dir == ImGuiDir_Down && day > 0.0f))
            {
                result->DistAxial = dist_axial;
                new_best = true;
            }

    return new_best;
}